

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O2

uint read_4(file *file,png_uint_32 *pu)

{
  int iVar1;
  uint uVar2;
  png_uint_32 pVar3;
  
  uVar2 = 0;
  pVar3 = 0;
  do {
    iVar1 = read_byte(file);
    if (iVar1 == -1) {
      return uVar2;
    }
    pVar3 = pVar3 * 0x100 + iVar1;
    uVar2 = uVar2 + 1;
  } while (uVar2 != 4);
  *pu = pVar3;
  return 4;
}

Assistant:

static unsigned int
read_4(struct file *file, png_uint_32 *pu)
   /* Read four bytes, returns the number of bytes read successfully and, if all
    * four bytes are read, assigns the result to *pu.
    */
{
   unsigned int i = 0;
   png_uint_32 val = 0;

   do
   {
      int ch = read_byte(file);

      if (ch == EOF)
         return i;

      val = (val << 8) + ch;
   } while (++i < 4);

   *pu = val;
   return i;
}